

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O3

void secp256k1_modinv32_normalize_30
               (secp256k1_modinv32_signed30 *r,int32_t sign,secp256k1_modinv32_modinfo *modinfo)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int32_t cond_add;
  int32_t cond_negate;
  
  uVar11 = r->v[8] >> 0x1f;
  uVar4 = (modinfo->modulus).v[0];
  uVar6 = (modinfo->modulus).v[1];
  uVar8 = (modinfo->modulus).v[2];
  uVar10 = (modinfo->modulus).v[3];
  uVar13 = (modinfo->modulus).v[4];
  uVar16 = (modinfo->modulus).v[5];
  uVar19 = (modinfo->modulus).v[6];
  uVar1 = (modinfo->modulus).v[7];
  uVar2 = (modinfo->modulus).v[8];
  uVar14 = sign >> 0x1f;
  uVar12 = ((uVar11 & uVar4) + r->v[0] ^ uVar14) - uVar14;
  uVar18 = ((int)uVar12 >> 0x1e) + (((uVar11 & uVar6) + r->v[1] ^ uVar14) - uVar14);
  uVar15 = ((int)uVar18 >> 0x1e) + (((uVar11 & uVar8) + r->v[2] ^ uVar14) - uVar14);
  uVar3 = ((int)uVar15 >> 0x1e) + (((uVar11 & uVar10) + r->v[3] ^ uVar14) - uVar14);
  uVar5 = ((int)uVar3 >> 0x1e) + (((uVar11 & uVar13) + r->v[4] ^ uVar14) - uVar14);
  uVar7 = ((int)uVar5 >> 0x1e) + (((uVar11 & uVar16) + r->v[5] ^ uVar14) - uVar14);
  uVar9 = ((int)uVar7 >> 0x1e) + (((uVar11 & uVar19) + r->v[6] ^ uVar14) - uVar14);
  uVar17 = ((int)uVar9 >> 0x1e) + (((uVar11 & uVar1) + r->v[7] ^ uVar14) - uVar14);
  iVar20 = ((int)uVar17 >> 0x1e) + (((uVar11 & uVar2) + r->v[8] ^ uVar14) - uVar14);
  uVar14 = iVar20 >> 0x1f;
  uVar11 = (uVar4 & uVar14) + (uVar12 & 0x3fffffff);
  uVar4 = ((int)uVar11 >> 0x1e) + (uVar6 & uVar14) + (uVar18 & 0x3fffffff);
  uVar6 = ((int)uVar4 >> 0x1e) + (uVar8 & uVar14) + (uVar15 & 0x3fffffff);
  uVar8 = ((int)uVar6 >> 0x1e) + (uVar10 & uVar14) + (uVar3 & 0x3fffffff);
  uVar10 = ((int)uVar8 >> 0x1e) + (uVar13 & uVar14) + (uVar5 & 0x3fffffff);
  uVar13 = ((int)uVar10 >> 0x1e) + (uVar16 & uVar14) + (uVar7 & 0x3fffffff);
  uVar16 = ((int)uVar13 >> 0x1e) + (uVar19 & uVar14) + (uVar9 & 0x3fffffff);
  uVar19 = ((int)uVar16 >> 0x1e) + (uVar1 & uVar14) + (uVar17 & 0x3fffffff);
  r->v[0] = uVar11 & 0x3fffffff;
  r->v[1] = uVar4 & 0x3fffffff;
  r->v[2] = uVar6 & 0x3fffffff;
  r->v[3] = uVar8 & 0x3fffffff;
  r->v[4] = uVar10 & 0x3fffffff;
  r->v[5] = uVar13 & 0x3fffffff;
  r->v[6] = uVar16 & 0x3fffffff;
  r->v[7] = uVar19 & 0x3fffffff;
  r->v[8] = ((int)uVar19 >> 0x1e) + (uVar2 & uVar14) + iVar20;
  return;
}

Assistant:

static void secp256k1_modinv32_normalize_30(secp256k1_modinv32_signed30 *r, int32_t sign, const secp256k1_modinv32_modinfo *modinfo) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    int32_t r0 = r->v[0], r1 = r->v[1], r2 = r->v[2], r3 = r->v[3], r4 = r->v[4],
            r5 = r->v[5], r6 = r->v[6], r7 = r->v[7], r8 = r->v[8];
    volatile int32_t cond_add, cond_negate;

#ifdef VERIFY
    /* Verify that all limbs are in range (-2^30,2^30). */
    int i;
    for (i = 0; i < 9; ++i) {
        VERIFY_CHECK(r->v[i] >= -M30);
        VERIFY_CHECK(r->v[i] <= M30);
    }
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, -2) > 0); /* r > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 1) < 0); /* r < modulus */
#endif

    /* In a first step, add the modulus if the input is negative, and then negate if requested.
     * This brings r from range (-2*modulus,modulus) to range (-modulus,modulus). As all input
     * limbs are in range (-2^30,2^30), this cannot overflow an int32_t. Note that the right
     * shifts below are signed sign-extending shifts (see assumptions.h for tests that that is
     * indeed the behavior of the right shift operator). */
    cond_add = r8 >> 31;
    r0 += modinfo->modulus.v[0] & cond_add;
    r1 += modinfo->modulus.v[1] & cond_add;
    r2 += modinfo->modulus.v[2] & cond_add;
    r3 += modinfo->modulus.v[3] & cond_add;
    r4 += modinfo->modulus.v[4] & cond_add;
    r5 += modinfo->modulus.v[5] & cond_add;
    r6 += modinfo->modulus.v[6] & cond_add;
    r7 += modinfo->modulus.v[7] & cond_add;
    r8 += modinfo->modulus.v[8] & cond_add;
    cond_negate = sign >> 31;
    r0 = (r0 ^ cond_negate) - cond_negate;
    r1 = (r1 ^ cond_negate) - cond_negate;
    r2 = (r2 ^ cond_negate) - cond_negate;
    r3 = (r3 ^ cond_negate) - cond_negate;
    r4 = (r4 ^ cond_negate) - cond_negate;
    r5 = (r5 ^ cond_negate) - cond_negate;
    r6 = (r6 ^ cond_negate) - cond_negate;
    r7 = (r7 ^ cond_negate) - cond_negate;
    r8 = (r8 ^ cond_negate) - cond_negate;
    /* Propagate the top bits, to bring limbs back to range (-2^30,2^30). */
    r1 += r0 >> 30; r0 &= M30;
    r2 += r1 >> 30; r1 &= M30;
    r3 += r2 >> 30; r2 &= M30;
    r4 += r3 >> 30; r3 &= M30;
    r5 += r4 >> 30; r4 &= M30;
    r6 += r5 >> 30; r5 &= M30;
    r7 += r6 >> 30; r6 &= M30;
    r8 += r7 >> 30; r7 &= M30;

    /* In a second step add the modulus again if the result is still negative, bringing r to range
     * [0,modulus). */
    cond_add = r8 >> 31;
    r0 += modinfo->modulus.v[0] & cond_add;
    r1 += modinfo->modulus.v[1] & cond_add;
    r2 += modinfo->modulus.v[2] & cond_add;
    r3 += modinfo->modulus.v[3] & cond_add;
    r4 += modinfo->modulus.v[4] & cond_add;
    r5 += modinfo->modulus.v[5] & cond_add;
    r6 += modinfo->modulus.v[6] & cond_add;
    r7 += modinfo->modulus.v[7] & cond_add;
    r8 += modinfo->modulus.v[8] & cond_add;
    /* And propagate again. */
    r1 += r0 >> 30; r0 &= M30;
    r2 += r1 >> 30; r1 &= M30;
    r3 += r2 >> 30; r2 &= M30;
    r4 += r3 >> 30; r3 &= M30;
    r5 += r4 >> 30; r4 &= M30;
    r6 += r5 >> 30; r5 &= M30;
    r7 += r6 >> 30; r6 &= M30;
    r8 += r7 >> 30; r7 &= M30;

    r->v[0] = r0;
    r->v[1] = r1;
    r->v[2] = r2;
    r->v[3] = r3;
    r->v[4] = r4;
    r->v[5] = r5;
    r->v[6] = r6;
    r->v[7] = r7;
    r->v[8] = r8;

#ifdef VERIFY
    VERIFY_CHECK(r0 >> 30 == 0);
    VERIFY_CHECK(r1 >> 30 == 0);
    VERIFY_CHECK(r2 >> 30 == 0);
    VERIFY_CHECK(r3 >> 30 == 0);
    VERIFY_CHECK(r4 >> 30 == 0);
    VERIFY_CHECK(r5 >> 30 == 0);
    VERIFY_CHECK(r6 >> 30 == 0);
    VERIFY_CHECK(r7 >> 30 == 0);
    VERIFY_CHECK(r8 >> 30 == 0);
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 0) >= 0); /* r >= 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 1) < 0); /* r < modulus */
#endif
}